

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::TrackEventCategory::TrackEventCategory
          (TrackEventCategory *this,TrackEventCategory *param_1)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__TrackEventCategory_00407300;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  ::std::__cxx11::string::string((string *)&this->description_,(string *)&param_1->description_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->tags_,&param_1->tags_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TrackEventCategory::TrackEventCategory(const TrackEventCategory&) = default;